

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_StObjSlotChkUndecl
          (InterpreterStackFrame *this,Var instance,int32 slotIndex,Var value)

{
  WriteBarrierPtr<void> *this_00;
  DWORD DVar1;
  
  DVar1 = DynamicObject::GetOffsetOfAuxSlots();
  this_00 = (WriteBarrierPtr<void> *)
            (*(long *)((long)instance + (ulong)DVar1) + (long)slotIndex * 8);
  OP_ChkUndecl(this,this_00->ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_StObjSlotChkUndecl(Var instance, int32 slotIndex, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Field(Var) *slotArray = *(Field(Var)**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        OP_ChkUndecl(slotArray[slotIndex]);
        slotArray[slotIndex] = value;
    }